

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

void __thiscall
google::protobuf::EncodedDescriptorDatabase::EncodedDescriptorDatabase
          (EncodedDescriptorDatabase *this)

{
  DescriptorIndex<std::pair<const_void_*,_int>_> *in_RDI;
  
  DescriptorDatabase::DescriptorDatabase((DescriptorDatabase *)in_RDI);
  *(undefined ***)&(in_RDI->by_name_)._M_t._M_impl = &PTR__EncodedDescriptorDatabase_00959740;
  SimpleDescriptorDatabase::DescriptorIndex<std::pair<const_void_*,_int>_>::DescriptorIndex(in_RDI);
  std::vector<void_*,_std::allocator<void_*>_>::vector
            ((vector<void_*,_std::allocator<void_*>_> *)0x5408d5);
  return;
}

Assistant:

EncodedDescriptorDatabase::EncodedDescriptorDatabase() {}